

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

iterator __thiscall
llvm::yaml::Scanner::skip_while(Scanner *this,SkipWhileFunc Func,iterator Position)

{
  iterator pcVar1;
  iterator in_RCX;
  code *local_60;
  iterator i;
  iterator Position_local;
  SkipWhileFunc Func_local;
  Scanner *this_local;
  
  pcVar1 = in_RCX;
  do {
    i = pcVar1;
    local_60 = (code *)Func;
    if ((Func & 1) != 0) {
      local_60 = *(code **)(*(long *)(Position + (long)(&this->TokenQueue + -1) + 0x28) + (Func - 1)
                           );
    }
    pcVar1 = (iterator)(*local_60)(Position + (long)(&this->TokenQueue + -1) + 0x28,i);
  } while (pcVar1 != i);
  return i;
}

Assistant:

StringRef::iterator Scanner::skip_while( SkipWhileFunc Func
                                       , StringRef::iterator Position) {
  while (true) {
    StringRef::iterator i = (this->*Func)(Position);
    if (i == Position)
      break;
    Position = i;
  }
  return Position;
}